

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContextHook *pIVar1;
  ImGuiID IVar2;
  
  if (((*(long *)(hook + 0x10) != 0) && (*(int *)hook == 0)) && (*(int *)(hook + 4) != 7)) {
    ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
    IVar2 = ctx->HookIdNext + 1;
    ctx->HookIdNext = IVar2;
    pIVar1 = ImVector<ImGuiContextHook>::back(&ctx->Hooks);
    *(ImGuiID *)pIVar1 = IVar2;
    return ctx->HookIdNext;
  }
  __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0xd5c,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}